

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QCommonArrayOps<Symbol>::growAppend(QCommonArrayOps<Symbol> *this,Symbol *b,Symbol *e)

{
  long lVar1;
  bool bVar2;
  Symbol *e_00;
  Symbol *in_RDX;
  Symbol *in_RSI;
  QGenericArrayOps<Symbol> *in_RDI;
  long in_FS_OFFSET;
  qsizetype n;
  DataPointer old;
  QCommonArrayOps<Symbol> *c;
  GrowthPosition where;
  Symbol *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != in_RDX) {
    e_00 = (Symbol *)(((long)in_RDX - (long)in_RSI) / 0x30);
    c = (QCommonArrayOps<Symbol> *)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = (Symbol *)&DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<Symbol>::QArrayDataPointer
              ((QArrayDataPointer<Symbol> *)&stack0xffffffffffffffd8);
    bVar2 = q_points_into_range<QtPrivate::QCommonArrayOps<Symbol>,Symbol_const*>
                      ((Symbol **)this_00,c);
    where = (GrowthPosition)((ulong)c >> 0x20);
    if (bVar2) {
      QArrayDataPointer<Symbol>::detachAndGrow
                ((QArrayDataPointer<Symbol> *)this_00,where,(qsizetype)in_RDI,(Symbol **)in_RDX,
                 (QArrayDataPointer<Symbol> *)e_00);
    }
    else {
      QArrayDataPointer<Symbol>::detachAndGrow
                ((QArrayDataPointer<Symbol> *)this_00,where,(qsizetype)in_RDI,(Symbol **)in_RDX,
                 (QArrayDataPointer<Symbol> *)e_00);
    }
    QGenericArrayOps<Symbol>::copyAppend(in_RDI,in_RDX,e_00);
    QArrayDataPointer<Symbol>::~QArrayDataPointer((QArrayDataPointer<Symbol> *)e_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }